

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

void __thiscall
kj::Vector<kj::StringPtr>::addAll<kj::StringPtr_const*>
          (Vector<kj::StringPtr> *this,StringPtr *begin,StringPtr *end)

{
  StringPtr *pSVar1;
  size_t minCapacity;
  RemoveConst<kj::StringPtr> *__dest;
  size_t __n;
  
  pSVar1 = (this->builder).ptr;
  __dest = (this->builder).pos;
  __n = (long)end - (long)begin;
  minCapacity = ((long)__n >> 4) + ((long)__dest - (long)pSVar1 >> 4);
  if ((ulong)((long)(this->builder).endPtr - (long)pSVar1 >> 4) < minCapacity) {
    grow(this,minCapacity);
    __dest = (this->builder).pos;
  }
  if (end != begin) {
    memcpy(__dest,begin,__n);
  }
  (this->builder).pos = (RemoveConst<kj::StringPtr> *)((long)__dest + __n);
  return;
}

Assistant:

inline void addAll(Iterator begin, Iterator end) {
    size_t needed = builder.size() + (end - begin);
    if (needed > builder.capacity()) grow(needed);
    builder.addAll(begin, end);
  }